

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

ON_BezierCurve * __thiscall ON_BezierCurve::operator=(ON_BezierCurve *this,ON_PolynomialCurve *src)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  int pt_count;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  ON_4dPointArray pt;
  ON_SimpleArray<ON_4dPoint> local_80;
  ON_PolynomialCurve local_68;
  
  if ((src->m_dim < 1) ||
     (src->m_order < 2 || (src->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_count != src->m_order)) {
    Destroy(this);
  }
  else {
    ON_PolynomialCurve::ON_PolynomialCurve(&local_68);
    if (src->m_is_rat == 0) {
      local_68.m_dim = src->m_dim;
    }
    else {
      local_68.m_dim = 4;
    }
    local_68.m_is_rat = 0;
    local_68.m_domain.m_t[0] = 0.0;
    local_68.m_domain.m_t[1] = 1.0;
    local_68.m_order = src->m_order;
    ON_4dPointArray::operator=(&local_68.m_cv,&src->m_cv);
    if (src->m_is_rat != 0) {
      this->m_dim = this->m_dim + 1;
      this->m_is_rat = 0;
    }
    iVar5 = src->m_order;
    ON_4dPointArray::ON_4dPointArray(&pt,iVar5);
    lVar6 = (long)iVar5 + -1;
    lVar7 = 0;
    for (lVar4 = 0; lVar4 < src->m_order; lVar4 = lVar4 + 1) {
      if (lVar4 == 0) {
        dVar8 = 0.0;
      }
      else {
        dVar8 = 1.0;
        if (lVar4 < lVar6) {
          dVar8 = (double)(int)lVar4 * (1.0 / (double)(int)lVar6);
        }
      }
      pdVar3 = ON_4dPoint::operator_cast_to_double_
                         ((ON_4dPoint *)
                          ((long)&(pt.super_ON_SimpleArray<ON_4dPoint>.m_a)->x + lVar7));
      ON_PolynomialCurve::Evaluate(&local_68,dVar8,0,4,pdVar3);
      lVar7 = lVar7 + 0x20;
    }
    ON_4dPointArray::ON_4dPointArray((ON_4dPointArray *)&local_80,0);
    ON_4dPointArray::operator=(&local_68.m_cv,(ON_4dPointArray *)&local_80);
    ON_SimpleArray<ON_4dPoint>::~ON_SimpleArray(&local_80);
    iVar5 = src->m_dim;
    iVar2 = src->m_is_rat;
    if (iVar5 < 3 && iVar2 != 0) {
      lVar4 = 0;
      for (lVar6 = 0; pt_count = src->m_order, lVar6 < pt_count; lVar6 = lVar6 + 1) {
        dVar8 = *(double *)((long)&(pt.super_ON_SimpleArray<ON_4dPoint>.m_a)->w + lVar4);
        pdVar3 = ON_4dPoint::operator[]
                           ((ON_4dPoint *)
                            ((long)&(pt.super_ON_SimpleArray<ON_4dPoint>.m_a)->x + lVar4),src->m_dim
                           );
        *pdVar3 = dVar8;
        lVar4 = lVar4 + 0x20;
      }
      iVar5 = src->m_dim;
      iVar2 = src->m_is_rat;
    }
    else {
      pt_count = src->m_order;
    }
    Loft(this,(iVar5 + 1) - (uint)(iVar2 == 0),pt_count,4,
         &(pt.super_ON_SimpleArray<ON_4dPoint>.m_a)->x,0,(double *)0x0);
    bVar1 = IsValid(this);
    if ((bVar1) && (src->m_is_rat != 0)) {
      this->m_is_rat = 1;
      this->m_dim = this->m_dim + -1;
    }
    ON_SimpleArray<ON_4dPoint>::~ON_SimpleArray(&pt.super_ON_SimpleArray<ON_4dPoint>);
    ON_PolynomialCurve::~ON_PolynomialCurve(&local_68);
  }
  return this;
}

Assistant:

ON_BezierCurve& ON_BezierCurve::operator=(const ON_PolynomialCurve& src)
{
  //m_domain = src.m_domain;
  if ( src.m_dim > 0 && src.m_cv.Count() == src.m_order && src.m_order >= 2 ) 
  {
    int i;
    
    ON_PolynomialCurve s; // scratch poly for homogeneous evaluation
    s.m_dim = src.m_is_rat ? 4 : src.m_dim; 
    s.m_is_rat = 0;
    s.m_domain.m_t[0] = 0.0;
    s.m_domain.m_t[1] = 1.0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;

    if ( src.m_is_rat ) {
      m_dim++;
      m_is_rat = 0;
    }     
    const int degree = src.m_order-1;
    const double d = 1.0/degree;
    double t;
    ON_4dPointArray pt(src.m_order);
    for ( i = 0; i < src.m_order; i++ ) 
    {
      if ( i == 0 )
        t = 0.0;
      else if ( i < degree )
        t = i*d;
      else
        t = 1.0;
      s.Evaluate( t, 0, 4, pt[i] );
    }
    s.m_cv = 0;
    if ( src.m_is_rat && src.m_dim < 3 ) {
      for ( i = 0; i < src.m_order; i++ )
        pt[i][src.m_dim] = pt[i].w;
    }
    Loft( src.m_is_rat ? src.m_dim+1 : src.m_dim, src.m_order, 4, &pt[0].x, 0, nullptr );
    if ( IsValid() && src.m_is_rat ) {
      m_is_rat = 1;
      m_dim--;
    }
  }
  else {
    Destroy();
  }
  
  return *this;
}